

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_write_float_to_int32(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  OPJ_BYTE *l_dest_data;
  OPJ_FLOAT32 *l_src_data;
  long lVar1;
  
  if (p_nb_elem != 0) {
    lVar1 = 0;
    do {
      opj_write_bytes_LE((OPJ_BYTE *)p_dest_data,
                         (OPJ_UINT32)(long)*(float *)((long)p_src_data + lVar1 * 4),4);
      p_dest_data = (void *)((long)p_dest_data + 4);
      lVar1 = lVar1 + 1;
    } while (p_nb_elem != (OPJ_UINT32)lVar1);
  }
  return;
}

Assistant:

void  j2k_write_float_to_int32 (const void * p_src_data, void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
	OPJ_BYTE * l_dest_data = (OPJ_BYTE *) p_dest_data;
	OPJ_FLOAT32 * l_src_data = (OPJ_FLOAT32 *) p_src_data;
	OPJ_UINT32 i;
	OPJ_UINT32 l_temp;

	for (i=0;i<p_nb_elem;++i) {
		l_temp = (OPJ_UINT32) *(l_src_data++);

		opj_write_bytes(l_dest_data,l_temp,sizeof(OPJ_INT32));

		l_dest_data+=sizeof(OPJ_INT32);
	}
}